

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderImageLoadStoreTests.cpp
# Opt level: O3

void deqp::gles31::Functional::checkTextureTypeExtensions
               (ContextInfo *contextInfo,TextureType type,RenderContext *renderContext)

{
  bool bVar1;
  ContextType ctxType;
  NotSupportedError *this;
  long *plVar2;
  size_type *psVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  string local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  if (type == TEXTURETYPE_BUFFER) {
    bVar1 = glu::ContextInfo::isExtensionSupported(contextInfo,"GL_EXT_texture_buffer");
    if (!bVar1) {
      ctxType.super_ApiType.m_bits =
           (ApiType)(*renderContext->_vptr_RenderContext[2])(renderContext);
      bVar1 = glu::contextSupports(ctxType,(ApiType)0x23);
      if (!bVar1) {
        this = (NotSupportedError *)__cxa_allocate_exception(0x38);
        local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_88,"GL_EXT_texture_buffer","");
        std::operator+(&local_48,"Test requires ",&local_88);
        plVar2 = (long *)std::__cxx11::string::append((char *)&local_48);
        local_68._M_dataplus._M_p = (pointer)*plVar2;
        psVar3 = (size_type *)(plVar2 + 2);
        if ((size_type *)local_68._M_dataplus._M_p == psVar3) {
          local_68.field_2._M_allocated_capacity = *psVar3;
          local_68.field_2._8_8_ = plVar2[3];
          local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
        }
        else {
          local_68.field_2._M_allocated_capacity = *psVar3;
        }
        local_68._M_string_length = plVar2[1];
        *plVar2 = (long)psVar3;
        plVar2[1] = 0;
        *(undefined1 *)(plVar2 + 2) = 0;
        tcu::NotSupportedError::NotSupportedError(this,&local_68);
        __cxa_throw(this,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
      }
    }
  }
  return;
}

Assistant:

static inline void checkTextureTypeExtensions (const glu::ContextInfo& contextInfo, TextureType type, const RenderContext& renderContext)
{
	if (type == TEXTURETYPE_BUFFER && !contextInfo.isExtensionSupported(s_texBufExtString) && !glu::contextSupports(renderContext.getType(), glu::ApiType::es(3, 2)))
		throw tcu::NotSupportedError("Test requires " + string(s_texBufExtString) + " extension");
}